

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void dg::vr::RelationsAnalyzer::relateBounds
               (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
               Handle placeholder)

{
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> unsignedLowerBound;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> signedLowerBound;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_40;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_30;
  
  local_30 = getBoundOnPointedToValue(changeLocations,froms,SGE);
  local_40 = getBoundOnPointedToValue(changeLocations,froms,UGE);
  if (local_30.first != (ConstantInt *)0x0) {
    ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (newGraph,placeholder,local_30.second,&local_30.first);
  }
  if (local_40.first != (ConstantInt *)0x0) {
    ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (newGraph,placeholder,local_40.second,&local_40.first);
  }
  return;
}

Assistant:

void RelationsAnalyzer::relateBounds(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    auto signedLowerBound =
            getBoundOnPointedToValue(changeLocations, froms, Relation::SGE);
    auto unsignedLowerBound = getBoundOnPointedToValue(
            changeLocations, froms,
            Relation::UGE); // TODO collect upper bound too

    if (signedLowerBound.first)
        newGraph.set(placeholder, signedLowerBound.second,
                     signedLowerBound.first);

    if (unsignedLowerBound.first)
        newGraph.set(placeholder, unsignedLowerBound.second,
                     unsignedLowerBound.first);
}